

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleserver.hpp
# Opt level: O2

SOCKET SimpleServer::makeListener(int port,bool blocking)

{
  int __fd;
  int iVar1;
  int iSetOption;
  sockaddr local_28;
  
  __fd = socket(2,1,0);
  if (-1 < __fd) {
    iSetOption = 1;
    setsockopt(__fd,1,2,&iSetOption,4);
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    local_28.sa_family = 2;
    local_28.sa_data[2] = '\0';
    local_28.sa_data[3] = '\0';
    local_28.sa_data[4] = '\0';
    local_28.sa_data[5] = '\0';
    local_28.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
    iVar1 = bind(__fd,&local_28,0x10);
    if (iVar1 == -1) {
      __fd = -1;
    }
    else {
      listen(__fd,5);
      setBlocking(__fd,blocking);
    }
  }
  return __fd;
}

Assistant:

SOCKET makeListener(int port, bool blocking = true)
	{
		auto listSocket = socket(AF_INET, SOCK_STREAM, 0);
		if (SOCKET_IS_INVALID(listSocket))
			return listSocket;

		int iSetOption = 1;
		setsockopt(listSocket, SOL_SOCKET, SO_REUSEADDR, (char*)&iSetOption, sizeof(iSetOption));

		struct sockaddr_in listAddr;
		memset(&listAddr, 0, sizeof(listAddr));

		listAddr.sin_family = AF_INET;
		listAddr.sin_addr.s_addr = INADDR_ANY;
		listAddr.sin_port = htons(port);

		auto error = bind(listSocket, (struct sockaddr *) &listAddr, sizeof(listAddr));
		if (error == SOCKET_ERROR)
			return error;

		listen(listSocket, 5);

		setBlocking(listSocket, blocking);

		return listSocket;
	}